

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

int test_then_block(LexState *ls)

{
  int iVar1;
  LexState *unaff_retaddr;
  int condexit;
  int in_stack_ffffffffffffffec;
  undefined4 in_stack_fffffffffffffff0;
  
  luaX_next((LexState *)0x1151e3);
  iVar1 = cond(unaff_retaddr);
  checknext((LexState *)CONCAT44(iVar1,in_stack_fffffffffffffff0),in_stack_ffffffffffffffec);
  block(unaff_retaddr);
  return iVar1;
}

Assistant:

static int test_then_block(LexState*ls){
int condexit;
luaX_next(ls);
condexit=cond(ls);
checknext(ls,TK_THEN);
block(ls);
return condexit;
}